

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O0

void wasm::addExportedFunction(Module *wasm,Function *function)

{
  Export *this;
  Name *pNVar1;
  Export *export_;
  Function *function_local;
  Module *wasm_local;
  
  Module::addFunction(wasm,function);
  this = (Export *)operator_new(0x28);
  Export::Export(this);
  pNVar1 = Name::operator=(&this->value,(Name *)function);
  Name::operator=((Name *)this,pNVar1);
  this->kind = Function;
  Module::addExport(wasm,this);
  return;
}

Assistant:

void addExportedFunction(Module& wasm, Function* function) {
  wasm.addFunction(function);
  auto export_ = new Export;
  export_->name = export_->value = function->name;
  export_->kind = ExternalKind::Function;
  wasm.addExport(export_);
}